

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Imputer::ByteSizeLong(Imputer *this)

{
  uint32 uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    sVar4 = 9;
    goto LAB_00185dd3;
  case 2:
    uVar3 = (this->ImputedValue_).imputedint64value_ | 1;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar4 = (size_t)((int)lVar2 * 9 + 0x49U >> 6);
    break;
  case 3:
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)(this->ImputedValue_).imputeddoublearray_);
    break;
  case 4:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleVector>
                      ((this->ImputedValue_).imputeddoublearray_);
    break;
  case 5:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                      ((this->ImputedValue_).imputedint64array_);
    break;
  case 6:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringToDoubleMap>
                      ((this->ImputedValue_).imputedstringdictionary_);
    break;
  case 7:
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64ToDoubleMap>
                      ((this->ImputedValue_).imputedint64dictionary_);
    break;
  default:
    sVar4 = 0;
    goto LAB_00185dd3;
  }
  sVar4 = sVar4 + 1;
LAB_00185dd3:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0xd) {
    uVar3 = google::protobuf::internal::WireFormatLite::StringSize((string *)this->ReplaceValue_);
  }
  else {
    if (uVar1 != 0xc) {
      if (uVar1 == 0xb) {
        sVar4 = sVar4 + 9;
      }
      goto LAB_00185e11;
    }
    uVar3 = (this->ReplaceValue_).replaceint64value_ | 1;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (ulong)((int)lVar2 * 9 + 0x49U >> 6);
  }
  sVar4 = sVar4 + uVar3 + 1;
LAB_00185e11:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t Imputer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Imputer)
  size_t total_size = 0;

  switch (ImputedValue_case()) {
    // double imputedDoubleValue = 1;
    case kImputedDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 imputedInt64Value = 2;
    case kImputedInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->imputedint64value());
      break;
    }
    // string imputedStringValue = 3;
    case kImputedStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->imputedstringvalue());
      break;
    }
    // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
    case kImputedDoubleArray: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputeddoublearray_);
      break;
    }
    // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
    case kImputedInt64Array: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64array_);
      break;
    }
    // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
    case kImputedStringDictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedstringdictionary_);
      break;
    }
    // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
    case kImputedInt64Dictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64dictionary_);
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (ReplaceValue_case()) {
    // double replaceDoubleValue = 11;
    case kReplaceDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 replaceInt64Value = 12;
    case kReplaceInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->replaceint64value());
      break;
    }
    // string replaceStringValue = 13;
    case kReplaceStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}